

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_test.c
# Opt level: O1

void consumer_mu_n(testing t,mu_queue *q,int start,int count)

{
  nsync_mu *mu;
  undefined1 auVar1 [16];
  int iVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  ulong in_stack_ffffffffffffffc0;
  
  mu = &q->mu;
  uVar4 = 0;
  do {
    nsync::nsync_mu_lock(mu);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_stack_ffffffffffffffc0;
    iVar2 = nsync::nsync_mu_wait_with_deadline
                      ((nsync *)mu,(nsync_mu *)mu_queue_non_empty,(_func_int_void_ptr *)q,
                       (void *)0x0,(_func_int_void_ptr_void_ptr *)0x7fffffffffffffff,
                       (nsync_time)(auVar1 << 0x40),(nsync_note)0x3b9ac9ff);
    pvVar6 = (void *)0x0;
    if (iVar2 == 0) {
      if (q->count == 0) {
        testing_panic("q->count == 0");
      }
      iVar2 = q->pos;
      pvVar6 = q->data[iVar2];
      q->data[iVar2] = (void *)0x0;
      q->pos = iVar2 + 1;
      q->count = q->count + -1;
      if (iVar2 + 1 == q->limit) {
        q->pos = 0;
      }
    }
    nsync::nsync_mu_unlock(mu);
    if (pvVar6 == (void *)0x0) {
      pcVar3 = smprintf("mu_queue_get() returned 0 with no deadline");
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O1/cpp/testing/mu_wait_test.c"
                     ,0x80,pcVar3);
    }
    uVar5 = (int)pvVar6 - 0x10b189;
    if (uVar4 != uVar5) {
      pcVar3 = smprintf("mu_queue_get() returned bad value; want %d, got %d",(ulong)uVar4,
                        (ulong)uVar5);
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O1/cpp/testing/mu_wait_test.c"
                     ,0x85,pcVar3);
    }
    uVar4 = uVar4 + 3;
  } while (uVar4 != 300000);
  return;
}

Assistant:

static void consumer_mu_n (testing t, mu_queue *q, int start, int count) {
	int i;
	for (i = 0; i != count; i++) {
		void *v = mu_queue_get (q, nsync_time_no_deadline);
		int x;
		if (v == NULL) {
			TEST_FATAL (t, ("mu_queue_get() returned 0 with no deadline"));
		}
		x = PTR_TO_INT (v);
		if (x != (start+i)*3) {
			TEST_FATAL (t, ("mu_queue_get() returned bad value; want %d, got %d",
				   (start+i)*3, x));
		}
	}
}